

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void andres::marray_detail::stridesFromShape<unsigned_long*,unsigned_long*>
               (unsigned_long *begin,unsigned_long *end,unsigned_long *strideBegin,
               CoordinateOrder *coordinateOrder)

{
  long lVar1;
  difference_type dVar2;
  ulong uVar3;
  size_t tmp_1;
  size_t j_1;
  size_t tmp;
  size_t j;
  unsigned_long *strideIt;
  unsigned_long *shapeIt;
  size_t dimension;
  CoordinateOrder *coordinateOrder_local;
  unsigned_long *strideBegin_local;
  unsigned_long *end_local;
  unsigned_long *begin_local;
  
  dVar2 = std::distance<unsigned_long*>(begin,end);
  Assert<bool>(dVar2 != 0);
  uVar3 = std::distance<unsigned_long*>(begin,end);
  if (*coordinateOrder == FirstMajorOrder) {
    strideIt = begin + (uVar3 - 1);
    j = (size_t)(strideBegin + (uVar3 - 1));
    *(unsigned_long *)j = 1;
    for (tmp = 1; tmp < uVar3; tmp = tmp + 1) {
      lVar1 = *(long *)j;
      j = j - 8;
      *(unsigned_long *)j = lVar1 * *strideIt;
      strideIt = strideIt + -1;
    }
  }
  else {
    *strideBegin = 1;
    j = (size_t)strideBegin;
    strideIt = begin;
    for (tmp_1 = 1; tmp_1 < uVar3; tmp_1 = tmp_1 + 1) {
      lVar1 = *(long *)j;
      j = j + 8;
      *(unsigned_long *)j = lVar1 * *strideIt;
      strideIt = strideIt + 1;
    }
  }
  return;
}

Assistant:

inline void 
stridesFromShape
(
    ShapeIterator begin,
    ShapeIterator end,
    StridesIterator strideBegin,
    const CoordinateOrder& coordinateOrder
) 
{
    Assert(MARRAY_NO_ARG_TEST || std::distance(begin, end) != 0);
    std::size_t dimension = std::distance(begin, end);
    ShapeIterator shapeIt;
    StridesIterator strideIt;
    if(coordinateOrder == FirstMajorOrder) {
        shapeIt = begin + (dimension-1);
        strideIt = strideBegin + (dimension-1);
        *strideIt = 1;
        for(std::size_t j=1; j<dimension; ++j) {
            std::size_t tmp = *strideIt;
            --strideIt;
            (*strideIt) = tmp * (*shapeIt);
            --shapeIt;
        }
    }
    else {
        shapeIt = begin;
        strideIt = strideBegin;
        *strideIt = 1;
        for(std::size_t j=1; j<dimension; ++j) {
            std::size_t tmp = *strideIt;
            ++strideIt;
            (*strideIt) = tmp * (*shapeIt);
            ++shapeIt;
        }
    }
}